

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::collectBreakpointsMin
          (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int *nBp,int *minIdx,int *idx,int nnz,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upp,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *low,BreakpointSource src)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  fpclass_type fVar8;
  pointer pBVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  int32_t iVar11;
  int32_t *piVar12;
  int *piVar13;
  cpp_dec_float<50U,_int,_void> *v;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_268;
  cpp_dec_float<50U,_int,_void> *local_228;
  int *local_220;
  cpp_dec_float<50U,_int,_void> local_218;
  cpp_dec_float<50U,_int,_void> local_1d8;
  Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
  *local_1a0;
  cpp_dec_float<50U,_int,_void> local_198;
  cpp_dec_float<50U,_int,_void> local_158;
  int *local_120;
  cpp_dec_float<50U,_int,_void> local_118;
  int *local_e0;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_98;
  double local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_220 = nBp;
  local_218.fpclass = cpp_dec_float_finite;
  local_218.prec_elem = 10;
  local_218.data._M_elems[0] = 0;
  local_218.data._M_elems[1] = 0;
  local_218.data._M_elems[2] = 0;
  local_218.data._M_elems[3] = 0;
  local_218.data._M_elems[4] = 0;
  local_218.data._M_elems[5] = 0;
  local_218.data._M_elems._24_5_ = 0;
  local_218.data._M_elems[7]._1_3_ = 0;
  local_218.data._M_elems._32_5_ = 0;
  local_218.data._M_elems[9]._1_3_ = 0;
  local_218.exp = 0;
  local_218.neg = false;
  local_120 = minIdx;
  if (*nBp == 0) {
    ::soplex::infinity::__tls_init();
    piVar12 = &local_268.prec_elem;
    local_268.fpclass = cpp_dec_float_finite;
    local_268.prec_elem = 10;
    local_268.data._M_elems[0] = 0;
    local_268.data._M_elems[1] = 0;
    local_268.data._M_elems[2] = 0;
    local_268.data._M_elems[3] = 0;
    local_268.data._M_elems[4] = 0;
    local_268.data._M_elems[5] = 0;
    local_268.data._M_elems._24_5_ = 0;
    local_268.data._M_elems[7]._1_3_ = 0;
    local_268.data._M_elems._32_5_ = 0;
    local_268.data._M_elems[9]._1_3_ = 0;
    local_268.exp = 0;
    local_268.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_268,*(double *)(in_FS_OFFSET + -8));
  }
  else {
    pBVar9 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start + *minIdx;
    piVar12 = (int32_t *)((long)&(pBVar9->val).m_backend + 0x34);
    uVar3 = *(undefined8 *)((long)&(pBVar9->val).m_backend + 0x20);
    local_268.data._M_elems._32_5_ = SUB85(uVar3,0);
    local_268.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_268.data._M_elems._0_8_ = *(undefined8 *)&(pBVar9->val).m_backend;
    local_268.data._M_elems._8_8_ = *(undefined8 *)((long)&(pBVar9->val).m_backend + 8);
    local_268.data._M_elems._16_8_ = *(undefined8 *)((long)&(pBVar9->val).m_backend + 0x10);
    uVar3 = *(undefined8 *)((long)&(pBVar9->val).m_backend + 0x18);
    local_268.data._M_elems._24_5_ = SUB85(uVar3,0);
    local_268.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_268.exp = *(int *)((long)&(pBVar9->val).m_backend + 0x28);
    local_268.neg = *(bool *)((long)&(pBVar9->val).m_backend + 0x2c);
    local_268.fpclass = *(fpclass_type *)((long)&(pBVar9->val).m_backend + 0x30);
  }
  local_198.data._M_elems[9]._1_3_ = local_268.data._M_elems[9]._1_3_;
  local_198.data._M_elems._32_5_ = local_268.data._M_elems._32_5_;
  local_198.data._M_elems[7]._1_3_ = local_268.data._M_elems[7]._1_3_;
  local_198.data._M_elems._24_5_ = local_268.data._M_elems._24_5_;
  local_198.data._M_elems[4] = local_268.data._M_elems[4];
  local_198.data._M_elems[5] = local_268.data._M_elems[5];
  local_198.data._M_elems[0] = local_268.data._M_elems[0];
  local_198.data._M_elems[1] = local_268.data._M_elems[1];
  local_198.data._M_elems[2] = local_268.data._M_elems[2];
  local_198.data._M_elems[3] = local_268.data._M_elems[3];
  local_198.prec_elem = *piVar12;
  local_198.fpclass = local_268.fpclass;
  if (0 < nnz) {
    local_e0 = idx + nnz;
    pnVar1 = &(this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).epsilon;
    local_58 = *(double *)(in_FS_OFFSET + -8);
    local_48 = SUB84(local_58,0);
    uStack_50 = 0;
    uStack_44 = (uint)((ulong)local_58 >> 0x20) ^ 0x80000000;
    uStack_40 = 0;
    uStack_3c = 0x80000000;
    local_228 = &(this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend;
    local_1a0 = &this->breakpoints;
    local_198.exp = local_268.exp;
    local_198.neg = local_268.neg;
    do {
      iVar7 = *idx;
      local_d8.data._M_elems._32_8_ = *(undefined8 *)(upd[iVar7].m_backend.data._M_elems + 8);
      local_d8.data._M_elems._0_8_ = *(undefined8 *)upd[iVar7].m_backend.data._M_elems;
      local_d8.data._M_elems._8_8_ = *(undefined8 *)(upd[iVar7].m_backend.data._M_elems + 2);
      puVar2 = upd[iVar7].m_backend.data._M_elems + 4;
      local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_d8.exp = upd[iVar7].m_backend.exp;
      local_d8.neg = upd[iVar7].m_backend.neg;
      local_d8.fpclass = upd[iVar7].m_backend.fpclass;
      local_d8.prec_elem = upd[iVar7].m_backend.prec_elem;
      uVar3 = *(undefined8 *)
               ((this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).epsilon.m_backend.data._M_elems + 8);
      local_268.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_268.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_268.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
      local_268.data._M_elems._8_8_ =
           *(undefined8 *)
            ((this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.data._M_elems + 2);
      local_268.data._M_elems._16_8_ =
           *(undefined8 *)
            ((this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.data._M_elems + 4);
      uVar3 = *(undefined8 *)
               ((this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).epsilon.m_backend.data._M_elems + 6);
      local_268.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_268.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_268.exp =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.exp;
      local_268.neg =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.neg;
      fVar8 = (this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).epsilon.m_backend.fpclass;
      iVar11 = (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.prec_elem;
      local_268.fpclass =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.fpclass;
      local_268.prec_elem =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.prec_elem;
      if (fVar8 == cpp_dec_float_NaN || local_d8.fpclass == cpp_dec_float_NaN) {
LAB_002bd7a3:
        local_268.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
        local_268.data._M_elems._8_8_ =
             *(undefined8 *)
              ((this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.data._M_elems + 2);
        local_268.data._M_elems._16_8_ =
             *(undefined8 *)
              ((this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.data._M_elems + 4);
        uVar4 = *(undefined8 *)
                 ((this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).epsilon.m_backend.data._M_elems + 6);
        uVar3 = *(undefined8 *)
                 ((this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).epsilon.m_backend.data._M_elems + 8);
        local_268.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_268.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_268.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_268.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_268.prec_elem = iVar11;
        local_268.fpclass = fVar8;
        if (local_268.data._M_elems[0] != 0 || fVar8 != cpp_dec_float_finite) {
          local_268.neg = (bool)(local_268.neg ^ 1);
        }
        if (((fVar8 != cpp_dec_float_NaN) && (local_d8.fpclass != cpp_dec_float_NaN)) &&
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_d8,&local_268), iVar6 < 0)) {
          ::soplex::infinity::__tls_init();
          pcVar10 = &upp[iVar7].m_backend;
          local_268.fpclass = cpp_dec_float_finite;
          local_268.prec_elem = 10;
          local_268.data._M_elems[0] = 0;
          local_268.data._M_elems[1] = 0;
          local_268.data._M_elems[2] = 0;
          local_268.data._M_elems[3] = 0;
          local_268.data._M_elems[4] = 0;
          local_268.data._M_elems[5] = 0;
          local_268.data._M_elems._24_5_ = 0;
          local_268.data._M_elems[7]._1_3_ = 0;
          local_268.data._M_elems._32_5_ = 0;
          local_268.data._M_elems[9]._1_3_ = 0;
          local_268.exp = 0;
          local_268.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_268,local_58);
          if (((pcVar10->fpclass != cpp_dec_float_NaN) && (local_268.fpclass != cpp_dec_float_NaN))
             && (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar10,&local_268), iVar6 < 0)) {
            local_1d8.fpclass = cpp_dec_float_finite;
            local_1d8.prec_elem = 10;
            local_1d8.data._M_elems[0] = 0;
            local_1d8.data._M_elems[1] = 0;
            local_1d8.data._M_elems[2] = 0;
            local_1d8.data._M_elems[3] = 0;
            local_1d8.data._M_elems[4] = 0;
            local_1d8.data._M_elems[5] = 0;
            local_1d8.data._M_elems._24_5_ = 0;
            local_1d8.data._M_elems[7]._1_3_ = 0;
            local_1d8.data._M_elems._32_5_ = 0;
            local_1d8.data._M_elems[9]._1_3_ = 0;
            local_1d8.exp = 0;
            local_1d8.neg = false;
            if (&local_1d8 == &vec[iVar7].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1d8,pcVar10);
              if (local_1d8.data._M_elems[0] != 0 || local_1d8.fpclass != cpp_dec_float_finite) {
                local_1d8.neg = (bool)(local_1d8.neg ^ 1);
                goto LAB_002bdc22;
              }
LAB_002bdc3b:
              pcVar10 = local_228;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_268,0,(type *)0x0);
              iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_1d8,&local_268);
              if (0 < iVar6) goto LAB_002bdc66;
              uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 8);
              local_268.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_268.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_268.data._M_elems._0_8_ = *(undefined8 *)(pcVar10->data)._M_elems;
              local_268.data._M_elems._8_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 2);
              local_268.data._M_elems._16_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 6);
              local_268.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_268.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_268.exp =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.exp;
              bVar5 = (this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).fastDelta.m_backend.neg;
              local_268.fpclass =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.fpclass;
              local_268.prec_elem =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.prec_elem;
              fVar8 = local_268.fpclass | local_268.data._M_elems[0];
              pcVar10 = &local_268;
              local_268.neg = (bool)bVar5;
            }
            else {
              if (&local_1d8 != pcVar10) {
                uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 8);
                local_1d8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_1d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar10->data)._M_elems;
                local_1d8.data._M_elems._8_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 2);
                local_1d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 6);
                local_1d8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_1d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_1d8.exp = pcVar10->exp;
                local_1d8.neg = pcVar10->neg;
                local_1d8.fpclass = pcVar10->fpclass;
                local_1d8.prec_elem = pcVar10->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1d8,&vec[iVar7].m_backend);
LAB_002bdc22:
              pcVar10 = local_228;
              if (local_1d8.fpclass != cpp_dec_float_NaN) goto LAB_002bdc3b;
LAB_002bdc66:
              local_118.fpclass = cpp_dec_float_finite;
              local_118.prec_elem = 10;
              local_118.data._M_elems[0] = 0;
              local_118.data._M_elems[1] = 0;
              local_118.data._M_elems[2] = 0;
              local_118.data._M_elems[3] = 0;
              local_118.data._M_elems[4] = 0;
              local_118.data._M_elems[5] = 0;
              local_118.data._M_elems._24_5_ = 0;
              local_118.data._M_elems[7]._1_3_ = 0;
              local_118.data._M_elems._32_5_ = 0;
              local_118.data._M_elems[9]._1_3_ = 0;
              local_118.exp = 0;
              local_118.neg = false;
              v = &local_1d8;
              if (&local_118 != pcVar10) {
                local_118.data._M_elems._32_5_ = local_1d8.data._M_elems._32_5_;
                local_118.data._M_elems[9]._1_3_ = local_1d8.data._M_elems[9]._1_3_;
                local_118.data._M_elems[4] = local_1d8.data._M_elems[4];
                local_118.data._M_elems[5] = local_1d8.data._M_elems[5];
                local_118.data._M_elems._24_5_ = local_1d8.data._M_elems._24_5_;
                local_118.data._M_elems[7]._1_3_ = local_1d8.data._M_elems[7]._1_3_;
                local_118.data._M_elems[0] = local_1d8.data._M_elems[0];
                local_118.data._M_elems[1] = local_1d8.data._M_elems[1];
                local_118.data._M_elems[2] = local_1d8.data._M_elems[2];
                local_118.data._M_elems[3] = local_1d8.data._M_elems[3];
                local_118.exp = local_1d8.exp;
                local_118.neg = local_1d8.neg;
                local_118.fpclass = local_1d8.fpclass;
                local_118.prec_elem = local_1d8.prec_elem;
                v = pcVar10;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_118,v);
              local_98.data._M_elems[7]._1_3_ = local_118.data._M_elems[7]._1_3_;
              local_98.data._M_elems._24_5_ = local_118.data._M_elems._24_5_;
              local_98.data._M_elems[0] = local_118.data._M_elems[0];
              local_98.data._M_elems[1] = local_118.data._M_elems[1];
              uVar3 = local_98.data._M_elems._0_8_;
              local_98.data._M_elems[2] = local_118.data._M_elems[2];
              local_98.data._M_elems[3] = local_118.data._M_elems[3];
              local_98.data._M_elems[4] = local_118.data._M_elems[4];
              local_98.data._M_elems[5] = local_118.data._M_elems[5];
              local_98.data._M_elems[9]._1_3_ = local_118.data._M_elems[9]._1_3_;
              local_98.data._M_elems._32_5_ = local_118.data._M_elems._32_5_;
              local_98.exp = local_118.exp;
              local_98.neg = local_118.neg;
              local_98.fpclass = local_118.fpclass;
              local_98.prec_elem = local_118.prec_elem;
              local_98.data._M_elems[0] = local_118.data._M_elems[0];
              fVar8 = local_118.fpclass | local_98.data._M_elems[0];
              pcVar10 = &local_98;
              bVar5 = local_118.neg;
              local_98.data._M_elems._0_8_ = uVar3;
            }
            piVar13 = local_220;
            if (fVar8 != cpp_dec_float_finite) {
              pcVar10->neg = (bool)(bVar5 ^ 1);
            }
            local_158.fpclass = cpp_dec_float_finite;
            local_158.prec_elem = 10;
            local_158.data._M_elems[0] = 0;
            local_158.data._M_elems[1] = 0;
            local_158.data._M_elems[2] = 0;
            local_158.data._M_elems[3] = 0;
            local_158.data._M_elems[4] = 0;
            local_158.data._M_elems[5] = 0;
            local_158.data._M_elems._24_5_ = 0;
            local_158.data._M_elems[7]._1_3_ = 0;
            local_158.data._M_elems._32_5_ = 0;
            local_158.data._M_elems[9]._1_3_ = 0;
            local_158.exp = 0;
            local_158.neg = false;
            boost::multiprecision::default_ops::
            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_158,pcVar10,&local_d8);
            pBVar9 = (local_1a0->data).
                     super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pBVar9[*piVar13].idx = iVar7;
            goto LAB_002bdacb;
          }
        }
      }
      else {
        iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_d8,&local_268);
        if (iVar6 < 1) {
          local_268.exp =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.exp;
          local_268.neg =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.neg;
          fVar8 = (this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).epsilon.m_backend.fpclass;
          iVar11 = (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).epsilon.m_backend.prec_elem;
          goto LAB_002bd7a3;
        }
        ::soplex::infinity::__tls_init();
        pcVar10 = &low[iVar7].m_backend;
        local_268.fpclass = cpp_dec_float_finite;
        local_268.prec_elem = 10;
        local_268.data._M_elems[0] = 0;
        local_268.data._M_elems[1] = 0;
        local_268.data._M_elems[2] = 0;
        local_268.data._M_elems[3] = 0;
        local_268.data._M_elems[4] = 0;
        local_268.data._M_elems[5] = 0;
        local_268.data._M_elems._24_5_ = 0;
        local_268.data._M_elems[7]._1_3_ = 0;
        local_268.data._M_elems._32_5_ = 0;
        local_268.data._M_elems[9]._1_3_ = 0;
        local_268.exp = 0;
        local_268.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_268,(double)CONCAT44(uStack_44,local_48));
        if (((pcVar10->fpclass == cpp_dec_float_NaN) || (local_268.fpclass == cpp_dec_float_NaN)) ||
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (pcVar10,&local_268), iVar6 < 1)) goto LAB_002bdbb6;
        local_1d8.fpclass = cpp_dec_float_finite;
        local_1d8.prec_elem = 10;
        local_1d8.data._M_elems[0] = 0;
        local_1d8.data._M_elems[1] = 0;
        local_1d8.data._M_elems[2] = 0;
        local_1d8.data._M_elems[3] = 0;
        local_1d8.data._M_elems[4] = 0;
        local_1d8.data._M_elems[5] = 0;
        local_1d8.data._M_elems._24_5_ = 0;
        local_1d8.data._M_elems[7]._1_3_ = 0;
        local_1d8.data._M_elems._32_5_ = 0;
        local_1d8.data._M_elems[9]._1_3_ = 0;
        local_1d8.exp = 0;
        local_1d8.neg = false;
        if (&local_1d8 == &vec[iVar7].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_1d8,pcVar10);
          if (local_1d8.data._M_elems[0] != 0 || local_1d8.fpclass != cpp_dec_float_finite) {
            local_1d8.neg = (bool)(local_1d8.neg ^ 1);
            goto LAB_002bd95a;
          }
LAB_002bd96e:
          piVar13 = local_220;
          pcVar10 = local_228;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_268,0,(type *)0x0);
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1d8,&local_268);
          if (iVar6 < 0) goto LAB_002bd999;
        }
        else {
          if (&local_1d8 != pcVar10) {
            uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 8);
            local_1d8.data._M_elems._32_5_ = SUB85(uVar3,0);
            local_1d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_1d8.data._M_elems._0_8_ = *(undefined8 *)(pcVar10->data)._M_elems;
            local_1d8.data._M_elems._8_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 2);
            local_1d8.data._M_elems._16_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
            uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 6);
            local_1d8.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_1d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_1d8.exp = pcVar10->exp;
            local_1d8.neg = pcVar10->neg;
            local_1d8.fpclass = pcVar10->fpclass;
            local_1d8.prec_elem = pcVar10->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_1d8,&vec[iVar7].m_backend);
LAB_002bd95a:
          pcVar10 = local_228;
          piVar13 = local_220;
          if (local_1d8.fpclass != cpp_dec_float_NaN) goto LAB_002bd96e;
LAB_002bd999:
          local_268.fpclass = cpp_dec_float_finite;
          local_268.prec_elem = 10;
          local_268.data._M_elems[0] = 0;
          local_268.data._M_elems[1] = 0;
          local_268.data._M_elems[2] = 0;
          local_268.data._M_elems[3] = 0;
          local_268.data._M_elems[4] = 0;
          local_268.data._M_elems[5] = 0;
          local_268.data._M_elems._24_5_ = 0;
          local_268.data._M_elems[7]._1_3_ = 0;
          local_268.data._M_elems._32_5_ = 0;
          local_268.data._M_elems[9]._1_3_ = 0;
          local_268.exp = 0;
          local_268.neg = false;
          if (&local_268 != pcVar10) {
            uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 8);
            local_268.data._M_elems._32_5_ = SUB85(uVar3,0);
            local_268.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_268.data._M_elems._0_8_ = *(undefined8 *)(pcVar10->data)._M_elems;
            local_268.data._M_elems._8_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 2);
            local_268.data._M_elems._16_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
            uVar3 = *(undefined8 *)((pcVar10->data)._M_elems + 6);
            local_268.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_268.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_268.exp =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.exp;
            local_268.neg =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.neg;
            local_268.fpclass =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.fpclass;
            local_268.prec_elem =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.prec_elem;
          }
          pcVar10 = &local_268;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (pcVar10,&local_1d8);
        }
        local_158.fpclass = cpp_dec_float_finite;
        local_158.prec_elem = 10;
        local_158.data._M_elems[0] = 0;
        local_158.data._M_elems[1] = 0;
        local_158.data._M_elems[2] = 0;
        local_158.data._M_elems[3] = 0;
        local_158.data._M_elems[4] = 0;
        local_158.data._M_elems[5] = 0;
        local_158.data._M_elems._24_5_ = 0;
        local_158.data._M_elems[7]._1_3_ = 0;
        local_158.data._M_elems._32_5_ = 0;
        local_158.data._M_elems[9]._1_3_ = 0;
        local_158.exp = 0;
        local_158.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_158,pcVar10,&local_d8);
        pBVar9 = (local_1a0->data).
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar9[*piVar13].idx = iVar7;
LAB_002bdacb:
        iVar7 = *piVar13;
        pBVar9[iVar7].src = src;
        *(undefined8 *)&pBVar9[iVar7].val.m_backend = local_158.data._M_elems._0_8_;
        *(undefined8 *)((long)&pBVar9[iVar7].val.m_backend + 8) = local_158.data._M_elems._8_8_;
        puVar2 = (uint *)((long)&pBVar9[iVar7].val.m_backend + 0x10);
        *(undefined8 *)puVar2 = local_158.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_158.data._M_elems[7]._1_3_,local_158.data._M_elems._24_5_);
        *(ulong *)((long)&pBVar9[iVar7].val.m_backend + 0x20) =
             CONCAT35(local_158.data._M_elems[9]._1_3_,local_158.data._M_elems._32_5_);
        *(int *)((long)&pBVar9[iVar7].val.m_backend + 0x28) = local_158.exp;
        *(bool *)((long)&pBVar9[iVar7].val.m_backend + 0x2c) = local_158.neg;
        *(undefined8 *)((long)&pBVar9[iVar7].val.m_backend + 0x30) = local_158._48_8_;
        local_218.data._M_elems._0_8_ = local_158.data._M_elems._0_8_;
        local_218.data._M_elems._8_8_ = local_158.data._M_elems._8_8_;
        local_218.data._M_elems._16_8_ = local_158.data._M_elems._16_8_;
        local_218.data._M_elems._24_5_ = local_158.data._M_elems._24_5_;
        local_218.data._M_elems[7]._1_3_ = local_158.data._M_elems[7]._1_3_;
        local_218.data._M_elems._32_5_ = local_158.data._M_elems._32_5_;
        local_218.data._M_elems[9]._1_3_ = local_158.data._M_elems[9]._1_3_;
        local_218.exp = local_158.exp;
        local_218.neg = local_158.neg;
        local_218._48_8_ = local_158._48_8_;
        if ((local_158.fpclass == cpp_dec_float_NaN) || (local_198.fpclass == cpp_dec_float_NaN)) {
          iVar7 = *piVar13;
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_218,&local_198);
          iVar7 = *piVar13;
          if (iVar6 < 0) {
            local_198.data._M_elems[9]._1_3_ = local_218.data._M_elems[9]._1_3_;
            local_198.data._M_elems._32_5_ = local_218.data._M_elems._32_5_;
            local_198.data._M_elems[7]._1_3_ = local_218.data._M_elems[7]._1_3_;
            local_198.data._M_elems._24_5_ = local_218.data._M_elems._24_5_;
            local_198.data._M_elems[4] = local_218.data._M_elems[4];
            local_198.data._M_elems[5] = local_218.data._M_elems[5];
            local_198.data._M_elems[0] = local_218.data._M_elems[0];
            local_198.data._M_elems[1] = local_218.data._M_elems[1];
            local_198.data._M_elems[2] = local_218.data._M_elems[2];
            local_198.data._M_elems[3] = local_218.data._M_elems[3];
            local_198.exp = local_218.exp;
            local_198.neg = local_218.neg;
            local_198.fpclass = local_218.fpclass;
            local_198.prec_elem = local_218.prec_elem;
            *local_120 = iVar7;
          }
        }
        *piVar13 = iVar7 + 1;
      }
LAB_002bdbb6:
      if ((int)((ulong)((long)(this->breakpoints).data.
                              super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->breakpoints).data.
                             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6) <= *local_220) {
        std::
        vector<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
        ::resize(&local_1a0->data,(long)*local_220 * 2);
      }
      idx = idx + 1;
    } while (idx < local_e0);
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMin(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];

            curVal = (y >= 0) ? this->fastDelta / x : (this->fastDelta - y) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? -this->fastDelta / x : -(y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}